

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,SPIRType *in_type)

{
  bool bVar1;
  CompilerError *pCVar2;
  bool local_141;
  allocator local_117;
  allocator local_116;
  allocator local_115;
  allocator local_114;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  allocator local_110;
  allocator local_10f;
  allocator local_10e;
  allocator local_10d;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  allocator local_108;
  allocator local_107;
  allocator local_106;
  allocator local_105;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  string local_100;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  allocator local_8a;
  allocator local_89;
  string local_88;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  undefined1 local_5f;
  bool local_5e;
  allocator local_5d [6];
  bool same_size_cast;
  bool integral_cast;
  allocator local_49;
  string local_48;
  SPIRType *local_28;
  SPIRType *in_type_local;
  SPIRType *out_type_local;
  CompilerGLSL *this_local;
  
  local_28 = in_type;
  in_type_local = out_type;
  out_type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if (((out_type->pointer & 1U) == 0) && ((in_type->pointer & 1U) == 0)) {
    if (out_type->basetype == in_type->basetype) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_5d);
      ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
    }
    else {
      if (out_type->basetype == Boolean) {
        __assert_fail("out_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x25a5,
                      "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      if (in_type->basetype == Boolean) {
        __assert_fail("in_type.basetype != SPIRType::Boolean",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x25a6,
                      "virtual string diligent_spirv_cross::CompilerGLSL::bitcast_glsl_op(const SPIRType &, const SPIRType &)"
                     );
      }
      bVar1 = type_is_integral(out_type);
      local_141 = false;
      if (bVar1) {
        local_141 = type_is_integral(local_28);
      }
      local_5e = local_141;
      local_5f = in_type_local->width == local_28->width;
      if ((local_141 == false) || (!(bool)local_5f)) {
        if ((in_type_local->width == 8) &&
           (((0xf < local_28->width && (local_141 != false)) && (local_28->vecsize == 1)))) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"unpack8",&local_60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_60);
        }
        else if ((((local_28->width == 8) && (in_type_local->width == 0x10)) && (local_141 != false)
                 ) && (in_type_local->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"pack16",&local_61);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        }
        else if (((local_28->width == 8) && (in_type_local->width == 0x20)) &&
                ((local_141 != false && (in_type_local->vecsize == 1)))) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"pack32",&local_62);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
        }
        else if ((in_type_local->basetype == UInt) && (local_28->basetype == Float)) {
          bVar1 = is_legacy_es(this);
          if (bVar1) {
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar2,"Float -> Uint bitcast not supported on legacy ESSL.");
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_88,"GL_ARB_shader_bit_encoding",&local_89);
            require_extension_internal(this,&local_88);
            ::std::__cxx11::string::~string((string *)&local_88);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"floatBitsToUint",&local_8a);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_8a);
        }
        else if ((in_type_local->basetype == Int) && (local_28->basetype == Float)) {
          bVar1 = is_legacy_es(this);
          if (bVar1) {
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar2,"Float -> Int bitcast not supported on legacy ESSL.");
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_b0,"GL_ARB_shader_bit_encoding",&local_b1);
            require_extension_internal(this,&local_b0);
            ::std::__cxx11::string::~string((string *)&local_b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"floatBitsToInt",&local_b2);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_b2);
        }
        else if ((in_type_local->basetype == Float) && (local_28->basetype == UInt)) {
          bVar1 = is_legacy_es(this);
          if (bVar1) {
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar2,"Uint -> Float bitcast not supported on legacy ESSL.");
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_d8,"GL_ARB_shader_bit_encoding",&local_d9);
            require_extension_internal(this,&local_d8);
            ::std::__cxx11::string::~string((string *)&local_d8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"uintBitsToFloat",&local_da);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_da);
        }
        else if ((in_type_local->basetype == Float) && (local_28->basetype == Int)) {
          bVar1 = is_legacy_es(this);
          if (bVar1) {
            pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar2,"Int -> Float bitcast not supported on legacy ESSL.");
            __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x14a)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_100,"GL_ARB_shader_bit_encoding",&local_101);
            require_extension_internal(this,&local_100);
            ::std::__cxx11::string::~string((string *)&local_100);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"intBitsToFloat",&local_102);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_102);
        }
        else if ((in_type_local->basetype == Int64) && (local_28->basetype == Double)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"doubleBitsToInt64",&local_103);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_103);
        }
        else if ((in_type_local->basetype == UInt64) && (local_28->basetype == Double)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"doubleBitsToUint64",&local_104);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_104);
        }
        else if ((in_type_local->basetype == Double) && (local_28->basetype == Int64)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"int64BitsToDouble",&local_105);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_105);
        }
        else if ((in_type_local->basetype == Double) && (local_28->basetype == UInt64)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"uint64BitsToDouble",&local_106);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_106);
        }
        else if ((in_type_local->basetype == Short) && (local_28->basetype == Half)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"float16BitsToInt16",&local_107);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_107);
        }
        else if ((in_type_local->basetype == UShort) && (local_28->basetype == Half)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"float16BitsToUint16",&local_108);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_108);
        }
        else if ((in_type_local->basetype == Half) && (local_28->basetype == Short)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"int16BitsToFloat16",&local_109);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
        }
        else if ((in_type_local->basetype == Half) && (local_28->basetype == UShort)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"uint16BitsToFloat16",&local_10a);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10a);
        }
        else if (((in_type_local->basetype == UInt64) && (local_28->basetype == UInt)) &&
                (local_28->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"packUint2x32",&local_10b)
          ;
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10b);
        }
        else if (((in_type_local->basetype == UInt) && (local_28->basetype == UInt64)) &&
                (in_type_local->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackUint2x32",&local_10c);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10c);
        }
        else if (((in_type_local->basetype == Half) && (local_28->basetype == UInt)) &&
                (local_28->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackFloat2x16",&local_10d);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10d);
        }
        else if (((in_type_local->basetype == UInt) && (local_28->basetype == Half)) &&
                (local_28->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"packFloat2x16",&local_10e);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10e);
        }
        else if (((in_type_local->basetype == Int) && (local_28->basetype == Short)) &&
                (local_28->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"packInt2x16",&local_10f);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_10f);
        }
        else if (((in_type_local->basetype == Short) && (local_28->basetype == Int)) &&
                (local_28->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackInt2x16",&local_110);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_110);
        }
        else if (((in_type_local->basetype == UInt) && (local_28->basetype == UShort)) &&
                (local_28->vecsize == 2)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"packUint2x16",&local_111)
          ;
          ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
        }
        else if (((in_type_local->basetype == UShort) && (local_28->basetype == UInt)) &&
                (local_28->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackUint2x16",&local_112);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_112);
        }
        else if (((in_type_local->basetype == Int64) && (local_28->basetype == Short)) &&
                (local_28->vecsize == 4)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"packInt4x16",&local_113);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_113);
        }
        else if (((in_type_local->basetype == Short) && (local_28->basetype == Int64)) &&
                (local_28->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackInt4x16",&local_114);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_114);
        }
        else if (((in_type_local->basetype == UInt64) && (local_28->basetype == UShort)) &&
                (local_28->vecsize == 4)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"packUint4x16",&local_115)
          ;
          ::std::allocator<char>::~allocator((allocator<char> *)&local_115);
        }
        else if (((in_type_local->basetype == UShort) && (local_28->basetype == UInt64)) &&
                (local_28->vecsize == 1)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"unpackUint4x16",&local_116);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_116);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_117);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_117);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,in_type_local,0);
      }
    }
  }
  else {
    if ((out_type->vecsize == 2) || (in_type->vecsize == 2)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_48,"GL_EXT_buffer_reference_uvec2",&local_49);
      require_extension_internal(this,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,in_type_local,0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::bitcast_glsl_op(const SPIRType &out_type, const SPIRType &in_type)
{
	// OpBitcast can deal with pointers.
	if (out_type.pointer || in_type.pointer)
	{
		if (out_type.vecsize == 2 || in_type.vecsize == 2)
			require_extension_internal("GL_EXT_buffer_reference_uvec2");
		return type_to_glsl(out_type);
	}

	if (out_type.basetype == in_type.basetype)
		return "";

	assert(out_type.basetype != SPIRType::Boolean);
	assert(in_type.basetype != SPIRType::Boolean);

	bool integral_cast = type_is_integral(out_type) && type_is_integral(in_type);
	bool same_size_cast = out_type.width == in_type.width;

	// Trivial bitcast case, casts between integers.
	if (integral_cast && same_size_cast)
		return type_to_glsl(out_type);

	// Catch-all 8-bit arithmetic casts (GL_EXT_shader_explicit_arithmetic_types).
	if (out_type.width == 8 && in_type.width >= 16 && integral_cast && in_type.vecsize == 1)
		return "unpack8";
	else if (in_type.width == 8 && out_type.width == 16 && integral_cast && out_type.vecsize == 1)
		return "pack16";
	else if (in_type.width == 8 && out_type.width == 32 && integral_cast && out_type.vecsize == 1)
		return "pack32";

	// Floating <-> Integer special casts. Just have to enumerate all cases. :(
	// 16-bit, 32-bit and 64-bit floats.
	if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Uint bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToUint";
	}
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Float)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Float -> Int bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "floatBitsToInt";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::UInt)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Uint -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "uintBitsToFloat";
	}
	else if (out_type.basetype == SPIRType::Float && in_type.basetype == SPIRType::Int)
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("Int -> Float bitcast not supported on legacy ESSL.");
		else if (!options.es && options.version < 330)
			require_extension_internal("GL_ARB_shader_bit_encoding");
		return "intBitsToFloat";
	}

	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToInt64";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::Double)
		return "doubleBitsToUint64";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::Int64)
		return "int64BitsToDouble";
	else if (out_type.basetype == SPIRType::Double && in_type.basetype == SPIRType::UInt64)
		return "uint64BitsToDouble";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Half)
		return "float16BitsToInt16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::Half)
		return "float16BitsToUint16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::Short)
		return "int16BitsToFloat16";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UShort)
		return "uint16BitsToFloat16";

	// And finally, some even more special purpose casts.
	if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UInt && in_type.vecsize == 2)
		return "packUint2x32";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UInt64 && out_type.vecsize == 2)
		return "unpackUint2x32";
	else if (out_type.basetype == SPIRType::Half && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackFloat2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::Half && in_type.vecsize == 2)
		return "packFloat2x16";
	else if (out_type.basetype == SPIRType::Int && in_type.basetype == SPIRType::Short && in_type.vecsize == 2)
		return "packInt2x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int && in_type.vecsize == 1)
		return "unpackInt2x16";
	else if (out_type.basetype == SPIRType::UInt && in_type.basetype == SPIRType::UShort && in_type.vecsize == 2)
		return "packUint2x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt && in_type.vecsize == 1)
		return "unpackUint2x16";
	else if (out_type.basetype == SPIRType::Int64 && in_type.basetype == SPIRType::Short && in_type.vecsize == 4)
		return "packInt4x16";
	else if (out_type.basetype == SPIRType::Short && in_type.basetype == SPIRType::Int64 && in_type.vecsize == 1)
		return "unpackInt4x16";
	else if (out_type.basetype == SPIRType::UInt64 && in_type.basetype == SPIRType::UShort && in_type.vecsize == 4)
		return "packUint4x16";
	else if (out_type.basetype == SPIRType::UShort && in_type.basetype == SPIRType::UInt64 && in_type.vecsize == 1)
		return "unpackUint4x16";

	return "";
}